

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O2

vector sptk::swipe::swipe(vector<double,_std::allocator<double>_> *waveform,double samplerate,
                         double min,double max,double st,double dt)

{
  pointer pdVar1;
  double dVar2;
  double dVar3;
  vector fERBs;
  vector fERBs_00;
  vector d;
  vector d_00;
  vector d_01;
  intvector ws;
  intvector ws_00;
  intvector ps;
  intvector ps_00;
  intvector ps_01;
  uint uVar4;
  uint xSz;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  double *extraout_RDX_02;
  double *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  swipe *psVar14;
  int iVar15;
  undefined8 in_R8;
  ulong uVar16;
  ulong uVar17;
  double hz;
  double dVar18;
  intvector iVar19;
  vector vVar20;
  matrix S;
  vector vVar21;
  intvector ones;
  vector yr_vector;
  intvector yr_vector_00;
  intvector yr_vector_01;
  vector yr_vector_02;
  vector yr_vector_03;
  vector yr_vector_04;
  matrix yr_matrix;
  vector x;
  vector x_00;
  vector x_01;
  vector pc;
  vector pc_00;
  vector pc_01;
  vector pc_02;
  double local_168;
  undefined4 uStack_ec;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  undefined4 uStack_8c;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  int *piVar9;
  double *pdVar10;
  double *extraout_RDX;
  double **extraout_RDX_05;
  
  hz = samplerate * 0.5;
  local_168 = max;
  if (hz < max) {
    fwrite("Max pitch exceeds Nyquist frequency...",0x26,1,_stderr);
    fprintf(_stderr,"max pitch set to %.2f Hz.\n",SUB84(hz,0));
    local_168 = hz;
  }
  dVar18 = samplerate * 8.0;
  if (samplerate < dt) {
    fprintf(_stderr,"Timestep > SR...timestep set to %f.\n");
    dt = samplerate;
  }
  dVar2 = log2(dVar18 / min);
  dVar3 = log2(dVar18 / local_168);
  dVar2 = floor((dVar2 - dVar3) + *(double *)(&DAT_001263f0 + (ulong)(dVar2 - dVar3 < 0.0) * 8));
  iVar19 = makeiv((int)(dVar2 + 1.0));
  piVar9 = iVar19.v;
  uVar17 = 0;
  uVar4 = iVar19.x;
  uVar16 = 0;
  if (0 < (int)uVar4) {
    uVar16 = (ulong)uVar4;
  }
  for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
    dVar2 = log2(dVar18 / min);
    dVar2 = floor(dVar2 + *(double *)(&DAT_001263f0 + (ulong)(dVar2 < 0.0) * 8));
    dVar2 = exp2(dVar2);
    dVar3 = exp2((double)(int)uVar17);
    piVar9[uVar17] = (int)(dVar2 / dVar3);
  }
  dVar2 = log2(local_168);
  dVar3 = log2(min);
  dVar2 = ceil((dVar2 - dVar3) / 0.0104167);
  vVar20 = makev((int)dVar2);
  pdVar10 = vVar20.v;
  xSz = vVar20.x;
  vVar20 = makev(xSz);
  pdVar11 = vVar20.v;
  uVar5 = vVar20.x;
  local_168 = 0.0;
  psVar14 = (swipe *)(ulong)xSz;
  while (0 < (int)psVar14) {
    psVar14 = psVar14 + -1;
    local_168 = log2(min);
    local_168 = (double)(int)psVar14 * 0.0104167 + local_168;
    dVar2 = exp2(local_168);
    pdVar10[(ulong)psVar14 & 0xffffffff] = dVar2;
    dVar2 = log2(dVar18 / (double)*piVar9);
    pdVar11[(ulong)psVar14 & 0xffffffff] = (local_168 + 1.0) - dVar2;
  }
  uVar16 = (ulong)((long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar15 = (int)uVar16;
  vVar20 = makev(iVar15);
  pdVar12 = vVar20.v;
  uVar6 = vVar20.x;
  pdVar1 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar17 = 0;
  uVar16 = uVar16 & 0xffffffff;
  if (iVar15 < 1) {
    uVar16 = uVar17;
  }
  for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
    pdVar12[uVar17] = pdVar1[uVar17] * 3.0517578125e-05;
  }
  dVar18 = hz2erb(hz);
  dVar2 = exp2(local_168);
  dVar2 = hz2erb(dVar2 * 0.25);
  dVar18 = ceil((dVar18 - dVar2) / 0.1);
  vVar20 = makev((int)dVar18);
  pdVar13 = vVar20.v;
  uVar7 = vVar20.x;
  dVar18 = hz2erb(min * 0.25);
  uVar17 = 0;
  uVar16 = 0;
  if (0 < (int)uVar7) {
    uVar16 = (ulong)uVar7;
  }
  for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
    dVar2 = pow(10.0,((double)(int)uVar17 * 0.1 + dVar18) / 21.4);
    pdVar13[uVar17] = (dVar2 + -1.0) * 229.0;
  }
  dVar18 = floor(pdVar13[(long)(int)uVar7 + -1] / *pdVar10 + -0.75);
  iVar19 = onesiv((int)dVar18);
  ones.v = iVar19.v;
  uVar8 = iVar19.x;
  ones._0_8_ = ones.v;
  sieve((swipe *)(ulong)uVar8,ones);
  *ones.v = 1;
  dVar18 = ceil(((double)(int)uVar6 / samplerate) / dt);
  S = zerom(xSz,(int)dVar18);
  ps._4_4_ = uStack_6c;
  ps.x = uVar8;
  iVar19._4_4_ = uStack_5c;
  iVar19.x = uVar4;
  d._4_4_ = uStack_4c;
  d.x = uVar5;
  vVar20._4_4_ = uStack_3c;
  vVar20.x = uVar7;
  x._4_4_ = 0;
  x.x = uVar6;
  vVar20.v = pdVar13;
  d.v = pdVar11;
  iVar19.v = piVar9;
  ps.v = ones.v;
  x.v = pdVar12;
  pc_00.v = pdVar10;
  pc_00._0_8_ = in_R8;
  Sfirst(S,x,pc_00,vVar20,d,iVar19,ps,hz,samplerate,dt,0);
  for (iVar15 = 1; iVar15 < (int)(uVar4 - 1); iVar15 = iVar15 + 1) {
    ps_00._4_4_ = uStack_ac;
    ps_00.x = uVar8;
    ws._4_4_ = uStack_9c;
    ws.x = uVar4;
    d_00._4_4_ = uStack_8c;
    d_00.x = uVar5;
    fERBs._4_4_ = uStack_7c;
    fERBs.x = uVar7;
    x_00._4_4_ = 0;
    x_00.x = uVar6;
    fERBs.v = pdVar13;
    d_00.v = pdVar11;
    ws.v = piVar9;
    ps_00.v = ones.v;
    x_00.v = pdVar12;
    pc_01.v = pdVar10;
    pc_01._0_8_ = in_R8;
    Snth(S,x_00,pc_01,fERBs,d_00,ws,ps_00,hz,samplerate,dt,iVar15);
  }
  ps_01._4_4_ = uStack_ec;
  ps_01.x = uVar8;
  ws_00._4_4_ = uStack_dc;
  ws_00.x = uVar4;
  d_01._4_4_ = uStack_cc;
  d_01.x = uVar5;
  fERBs_00._4_4_ = uStack_bc;
  fERBs_00.x = uVar7;
  x_01._4_4_ = 0;
  x_01.x = uVar6;
  fERBs_00.v = pdVar13;
  d_01.v = pdVar11;
  ws_00.v = piVar9;
  ps_01.v = ones.v;
  x_01.v = pdVar12;
  pc_02.v = pdVar10;
  pc_02._0_8_ = in_R8;
  Slast(S,x_01,pc_02,fERBs_00,d_01,ws_00,ps_01,hz,samplerate,dt,iVar15);
  yr_vector.v = extraout_RDX;
  yr_vector._0_8_ = pdVar13;
  freev((swipe *)(ulong)uVar7,yr_vector);
  yr_vector_00.v = extraout_RDX_00;
  yr_vector_00._0_8_ = piVar9;
  freeiv((swipe *)(ulong)uVar4,yr_vector_00);
  yr_vector_01.v = extraout_RDX_01;
  yr_vector_01._0_8_ = ones.v;
  freeiv((swipe *)(ulong)uVar8,yr_vector_01);
  yr_vector_02.v = extraout_RDX_02;
  yr_vector_02._0_8_ = pdVar11;
  freev((swipe *)(ulong)uVar5,yr_vector_02);
  yr_vector_03.v = extraout_RDX_03;
  yr_vector_03._0_8_ = pdVar12;
  freev((swipe *)(ulong)uVar6,yr_vector_03);
  pc.v = pdVar10;
  pc._0_8_ = extraout_RDX_04;
  vVar20 = pitch(S,pc,st);
  yr_vector_04.v = vVar20.v;
  vVar21.x = vVar20.x;
  yr_vector_04._0_8_ = pdVar10;
  freev((swipe *)(ulong)xSz,yr_vector_04);
  yr_matrix.m = extraout_RDX_05;
  yr_matrix._0_8_ = S.m;
  freem(S._0_8_,yr_matrix);
  vVar21._4_4_ = 0;
  vVar21.v = yr_vector_04.v;
  return vVar21;
}

Assistant:

vector swipe(const std::vector<double>& waveform, double samplerate, double min,
             double max, double st, double dt) {
#endif
    int i; 
    double td = 0.;
#if 0
    SF_INFO info;
    SNDFILE* source = sf_open_fd(fid, SFM_READ, &info, true);
    if (source == NULL || info.sections < 1) 
        return(makev(0)); 
    double nyquist = info.samplerate / 2.;
    double nyquist2 = info.samplerate;
    double nyquist16 = info.samplerate * 8.;
#else
    double nyquist = samplerate / 2.;
    double nyquist2 = samplerate;
    double nyquist16 = samplerate * 8.;
#endif
    if (max > nyquist) {
        max = nyquist;
        fprintf(stderr, "Max pitch exceeds Nyquist frequency...");
        fprintf(stderr, "max pitch set to %.2f Hz.\n", max);
    }
    if (dt > nyquist2) {
        dt = nyquist2;
        fprintf(stderr, "Timestep > SR...timestep set to %f.\n", nyquist2);
    }
    intvector ws = makeiv(round(log2((nyquist16) / min) -  
                                log2((nyquist16) / max)) + 1); 
    for (i = 0; i < ws.x; i++)
        ws.v[i] = pow(2, round(log2(nyquist16 / min))) / pow(2, i);
    vector pc = makev(ceil((log2(max) - log2(min)) / DLOG2P));
    vector d = makev(pc.x);
    for (i = pc.x - 1; i >= 0; i--) { 
        td = log2(min) + (i * DLOG2P);
        pc.v[i] = pow(2, td);
        d.v[i] = 1. + td - log2(nyquist16 / ws.v[0]); 
    } // td now equals log2(min)
#if 0
    vector x = makev((int) info.frames); // read in the signal
    sf_read_double(source, x.v, x.x);
    sf_close(source); // takes wavf with it, too
#else
    double n = 1. / 32768.;
    int frames = static_cast<int>(waveform.size());
    vector x = makev(frames);
    for (i = 0; i < frames; i++)
        x.v[i] = waveform[i] * n;
#endif
    vector fERBs = makev(ceil((hz2erb(nyquist) - 
                               hz2erb(pow(2, td) / 4)) / DERBS));
    td = hz2erb(min / 4.);
    for (i = 0; i < fERBs.x; i++) 
        fERBs.v[i] = erb2hz(td + (i * DERBS));
    intvector ps = onesiv(floor(fERBs.v[fERBs.x - 1] / pc.v[0] - .75));
    sieve(ps);
    ps.v[0] = PR; // hack to make 1 "act" prime...don't ask
    matrix S = zerom(pc.x, ceil(((double) x.x / nyquist2) / dt));
    Sfirst(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, 0); 
    for (i = 1; i < ws.x - 1; i++) // S is updated inline here
        Snth(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, i);
    // i is now (ws.x - 1)
    Slast(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, i);
    freev(fERBs); 
    freeiv(ws);
    freeiv(ps);
    freev(d);  
    freev(x);
    vector p = pitch(S, pc, st); // find pitch using strength matrix
    freev(pc);
    freem(S);
    return(p);
}